

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpull.c
# Opt level: O1

int nn_xpull_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase *self;
  
  self = (nn_sockbase *)nn_alloc_(0x198);
  if (self != (nn_sockbase *)0x0) {
    nn_sockbase_init(self,&nn_xpull_sockbase_vfptr,hint);
    nn_fq_init((nn_fq *)(self + 1));
    *sockbase = self;
    return 0;
  }
  nn_xpull_create_cold_1();
}

Assistant:

int nn_xpull_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xpull *self;

    self = nn_alloc (sizeof (struct nn_xpull), "socket (pull)");
    alloc_assert (self);
    nn_xpull_init (self, &nn_xpull_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}